

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test::~SumSquares1DTest_ExtremeValues_Test
          (SumSquares1DTest_ExtremeValues_Test *this)

{
  SumSquares1DTest_ExtremeValues_Test *in_stack_00000010;
  
  anon_unknown.dwarf_149ae79::SumSquares1DTest_ExtremeValues_Test::
  ~SumSquares1DTest_ExtremeValues_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(SumSquares1DTest, ExtremeValues) {
  DECLARE_ALIGNED(16, int16_t, src[kMaxSize * kMaxSize]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    if (rng_(2)) {
      for (int i = 0; i < kMaxSize * kMaxSize; ++i) src[i] = kInt13Max;
    } else {
      for (int i = 0; i < kMaxSize * kMaxSize; ++i) src[i] = -kInt13Max;
    }

    // Block size is between 64 and 128 * 128 and is always a multiple of 64.
    const int n = (rng_(255) + 1) * 64;

    const uint64_t ref_res = params_.ref_func(src, n);
    uint64_t tst_res;
    API_REGISTER_STATE_CHECK(tst_res = params_.tst_func(src, n));

    ASSERT_EQ(ref_res, tst_res);
  }
}